

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int sched_thread_cleanup(mk_sched_worker *sched,mk_list *list)

{
  mk_list *__mptr;
  mk_http_thread *mth;
  mk_list *head;
  mk_list *tmp;
  int c;
  mk_list *list_local;
  mk_sched_worker *sched_local;
  
  tmp._4_4_ = 0;
  mth = (mk_http_thread *)list->next;
  head = (mk_list *)mth->session;
  while (mth != (mk_http_thread *)list) {
    mk_http_thread_destroy((mk_http_thread *)&mth[-1].request);
    tmp._4_4_ = tmp._4_4_ + 1;
    mth = (mk_http_thread *)head;
    head = head->next;
  }
  return tmp._4_4_;
}

Assistant:

static int sched_thread_cleanup(struct mk_sched_worker *sched,
                                struct mk_list *list)
{
    int c = 0;
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_http_thread *mth;
    (void) sched;

    mk_list_foreach_safe(head, tmp, list) {
        mth = mk_list_entry(head, struct mk_http_thread, _head);
        mk_http_thread_destroy(mth);
        c++;
    }

    return c;

}